

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trd.c
# Opt level: O0

int trdmain(int argc,char **argv,appctxdef *appctx,char *save_ext)

{
  bool bVar1;
  int iVar2;
  osfildef *fp_00;
  long in_RSI;
  char *pcVar3;
  int in_EDI;
  errdef fr_;
  int i;
  int banner;
  osfildef *fp;
  int err;
  errcxdef errctx;
  char *in_stack_00006990;
  appctxdef *in_stack_00006998;
  char **in_stack_000069a0;
  int in_stack_000069ac;
  errcxdef *in_stack_000069b0;
  errdef *local_3b8;
  int local_3b0;
  char acStack_3ac [12];
  erradef aeStack_3a0 [10];
  int local_350;
  char *in_stack_fffffffffffffcc8;
  int local_280;
  errdef *local_268;
  _func_void_void_ptr_char_ptr_int_int_erradef_ptr *local_260;
  errdef **local_258;
  int local_250;
  uint local_4;
  
  bVar1 = true;
  local_260 = trdlogerr;
  local_258 = &local_268;
  local_250 = 0;
  fp_00 = oserrop(in_stack_fffffffffffffcc8);
  errini((errcxdef *)&local_268,fp_00);
  local_280 = 1;
  do {
    if (in_EDI <= local_280) {
LAB_00229226:
      if (bVar1) {
        trdptf("%s - A %s TADS %s Interpreter.\n",G_tads_oem_app_name,G_tads_oem_display_mode,
               "2.5.17");
        pcVar3 = "C";
        if (G_tads_oem_copyright_prefix != 0) {
          pcVar3 = "TADS c";
        }
        trdptf("%sopyright (c) 1993, 2012 by Michael J. Roberts.\n",pcVar3);
        trdptf("%s\n",G_tads_oem_author);
      }
      iVar2 = _setjmp((__jmp_buf_tag *)&stack0xfffffffffffffcb8);
      local_3b0 = iVar2;
      if (iVar2 == 0) {
        local_3b8 = local_268;
        local_268 = (errdef *)&local_3b8;
        trdmain1(in_stack_000069b0,in_stack_000069ac,in_stack_000069a0,in_stack_00006998,
                 in_stack_00006990);
        local_268 = local_3b8;
        close_log_files();
        local_4 = 0;
      }
      else {
        local_268 = local_3b8;
        if ((iVar2 != 0x5dc) && (iVar2 != 0x3f9)) {
          (*local_260)(local_258,acStack_3ac,iVar2,local_350,aeStack_3a0);
        }
        close_log_files();
        os_expause();
        local_4 = (uint)(iVar2 != 0x3f9);
      }
      return local_4;
    }
    iVar2 = strcmp(*(char **)(in_RSI + (long)local_280 * 8),"-nobanner");
    if (iVar2 == 0) {
      bVar1 = false;
      goto LAB_00229226;
    }
    local_280 = local_280 + 1;
  } while( true );
}

Assistant:

int trdmain(int argc, char *argv[], appctxdef *appctx, char *save_ext)
{
    errcxdef  errctx;
    int       err;
	osfildef *fp;
	int       banner = TRUE;                            /* show the banner? */
	int       i;

	VARUSED(banner);

	/* set up the error handler */
    errctx.errcxlog = trdlogerr;
    errctx.errcxlgc = &errctx;
    errctx.errcxfp  = (osfildef *)0;
    errctx.errcxofs = 0;
    errctx.errcxappctx = appctx;
    fp = oserrop(argv[0]);
	errini(&errctx, fp);

	/* check for the -nobanner option */
	for (i = 1 ; i < argc ; ++i)
	{
		if (strcmp(argv[i], "-nobanner") == 0)
		{
			banner = FALSE;
			break;
		}
	}
    
    /* copyright-date-string */
#ifndef NO_T2_COPYRIGHT_NOTICE
	if (banner)
	{
		trdptf("%s - A %s TADS %s Interpreter.\n",
			   G_tads_oem_app_name, G_tads_oem_display_mode,
			   TADS_RUNTIME_VERSION);
		trdptf("%sopyright (c) 1993, 2012 by Michael J. Roberts.\n",
			   G_tads_oem_copyright_prefix ? "TADS c" : "C");
		trdptf("%s\n", G_tads_oem_author);
	}
#endif
    
    ERRBEGIN(&errctx)
        trdmain1(&errctx, argc, argv, appctx, save_ext);
    ERRCATCH(&errctx, err)
        /* 
         *   log the error, unless it's usage (in which case we logged it
         *   already) or we're simply quitting the game 
         */
        if (err != ERR_USAGE && err != ERR_RUNQUIT)
            errclog(&errctx);
    
        /* close the error file */
        if (errctx.errcxfp != 0)
			osfcls(errctx.errcxfp);

		/* close the command and log files, if open */
		close_log_files();

        /* pause before exiting if the OS desires it */
        os_expause();

        /* return failure unless we're simply quitting the game */
        return (err == ERR_RUNQUIT ? OSEXSUCC : OSEXFAIL);
    ERREND(&errctx)
        
    /* close the error file if we opened it */
    if (errctx.errcxfp != 0)
        osfcls(errctx.errcxfp);
	
	/* close the command and log files, if open */
	close_log_files();

    /* successful completion */
    return(OSEXSUCC);
}